

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall FFFBFFFDReader::registerarea(FFFBFFFDReader *this,areainfo *bi)

{
  uint64_t uVar1;
  size_t sVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  
  pmVar6 = std::
           map<unsigned_long,_FFFBFFFDReader::areainfo,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_FFFBFFFDReader::areainfo>_>_>
           ::operator[](&this->_filemap,&bi->fileoffset);
  pmVar6->nblocks = bi->nblocks;
  uVar4 = bi->blocksize;
  uVar5 = *(undefined4 *)&bi->field_0x4;
  uVar1 = bi->fileoffset;
  uVar3 = bi->tag;
  sVar2 = bi->usedblocks;
  pmVar6->firstblock = bi->firstblock;
  pmVar6->tag = uVar3;
  pmVar6->usedblocks = sVar2;
  pmVar6->blocksize = uVar4;
  *(undefined4 *)&pmVar6->field_0x4 = uVar5;
  pmVar6->fileoffset = uVar1;
  if ((bi->firstblock != 0xffffffff) && ((bi->firstblock != 0 || (bi->tag - 1 < 0xfffffffe)))) {
    pmVar7 = std::
             map<unsigned_int,_FFFBFFFDReader::areainfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_FFFBFFFDReader::areainfo>_>_>
             ::operator[](&this->_areamap,&bi->firstblock);
    uVar5 = *(undefined4 *)&bi->field_0x4;
    uVar1 = bi->fileoffset;
    uVar3 = bi->firstblock;
    uVar4 = bi->tag;
    sVar2 = bi->usedblocks;
    pmVar7->blocksize = bi->blocksize;
    *(undefined4 *)&pmVar7->field_0x4 = uVar5;
    pmVar7->fileoffset = uVar1;
    pmVar7->firstblock = uVar3;
    pmVar7->tag = uVar4;
    pmVar7->usedblocks = sVar2;
    pmVar7->nblocks = bi->nblocks;
  }
  return;
}

Assistant:

void registerarea(const areainfo& bi)
    {
        _filemap[bi.fileoffset]= bi;
        if (hasblocknr(bi.firstblock, bi.tag))
            _areamap[bi.firstblock]= bi;
    }